

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::predictMotion(btSoftBody *this,btScalar dt)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  btCollisionShape *pbVar4;
  btScalar *pbVar5;
  Face *pFVar6;
  Node *pNVar7;
  btCollisionObject *in_RDI;
  float in_XMM0_Da;
  btScalar extraout_XMM0_Da;
  btVector3 bVar8;
  btVector3 x;
  Node *n_2;
  int ni_1;
  int i_2;
  btMatrix3x3 posetrs;
  btVector3 v;
  Face *f;
  int i_1;
  Node *n_1;
  btDbvtVolume vol;
  int c;
  btScalar clampDeltaV;
  btScalar maxDisplacement;
  btVector3 deltaV;
  Node *n;
  int ni;
  int i;
  btSoftBody *in_stack_000003b0;
  btScalar *in_stack_fffffffffffffd28;
  btSoftBody *in_stack_fffffffffffffd30;
  RContact *this_00;
  btVector3 *in_stack_fffffffffffffd38;
  btSoftBody *in_stack_fffffffffffffd40;
  btDbvtNode *in_stack_fffffffffffffd48;
  int newsize;
  undefined4 in_stack_fffffffffffffd50;
  btScalar in_stack_fffffffffffffd54;
  btDbvtVolume *in_stack_fffffffffffffd58;
  Face *in_stack_fffffffffffffd60;
  btScalar in_stack_fffffffffffffd68;
  float in_stack_fffffffffffffd6c;
  btSoftBody *in_stack_fffffffffffffd70;
  undefined1 local_280 [64];
  btSoftBody *in_stack_fffffffffffffdc0;
  btSoftBody *in_stack_fffffffffffffe20;
  int local_188;
  btScalar local_e4;
  btSoftBody *in_stack_ffffffffffffff50;
  btScalar local_88;
  btScalar local_84;
  btScalar local_80;
  btVector3 local_7c;
  btVector3 local_6c;
  int local_5c;
  float local_58;
  float local_54;
  undefined8 local_50;
  undefined8 local_48;
  btVector3 local_40;
  Node *local_30;
  undefined8 local_24;
  undefined8 local_1c;
  int local_14;
  int local_10;
  float local_c;
  
  local_c = in_XMM0_Da;
  if (((ulong)in_RDI[3].m_broadphaseHandle & 0x100000000) != 0) {
    *(undefined1 *)((long)&in_RDI[3].m_broadphaseHandle + 4) = 0;
    updateConstants(in_stack_fffffffffffffd30);
    btDbvt::clear((btDbvt *)in_stack_fffffffffffffd30);
    if (((uint)in_RDI[1].m_interpolationLinearVelocity.m_floats[1] & 0x10) != 0) {
      initializeFaceTree(in_stack_fffffffffffffd70);
    }
  }
  in_RDI[1].m_deactivationTime =
       local_c * in_RDI[1].m_interpolationWorldTransform.m_origin.m_floats[0];
  in_RDI[1].m_friction = 1.0 / in_RDI[1].m_deactivationTime;
  in_RDI[1].m_restitution = in_RDI[1].m_deactivationTime * 3.0;
  pbVar4 = btCollisionObject::getCollisionShape(in_RDI);
  (*pbVar4->_vptr_btCollisionShape[0xc])();
  in_RDI[1].m_rollingFriction = extraout_XMM0_Da;
  in_RDI[1].m_internalType = (int)(in_RDI[1].m_rollingFriction * 0.25);
  bVar8 = ::operator*((btVector3 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38->m_floats);
  local_24 = bVar8.m_floats._0_8_;
  local_1c = bVar8.m_floats._8_8_;
  addVelocity(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  applyForces(in_stack_fffffffffffffe20);
  local_10 = 0;
  local_14 = btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)&in_RDI[2].m_extensionPointer);
  for (; local_10 < local_14; local_10 = local_10 + 1) {
    local_30 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)&in_RDI[2].m_extensionPointer,
                          local_10);
    uVar1 = *(undefined8 *)((local_30->m_x).m_floats + 2);
    *(undefined8 *)(local_30->m_q).m_floats = *(undefined8 *)(local_30->m_x).m_floats;
    *(undefined8 *)((local_30->m_q).m_floats + 2) = uVar1;
    bVar8 = ::operator*((btVector3 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38->m_floats);
    local_50 = bVar8.m_floats._0_8_;
    local_48 = bVar8.m_floats._8_8_;
    bVar8 = ::operator*((btVector3 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38->m_floats);
    local_40.m_floats._0_8_ = bVar8.m_floats._0_8_;
    local_40.m_floats._8_8_ = bVar8.m_floats._8_8_;
    local_54 = *(float *)(*(long *)in_RDI[2].m_anisotropicFriction.m_floats + 0xc);
    local_58 = local_54 / in_RDI[1].m_deactivationTime;
    for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
      pbVar5 = btVector3::operator_cast_to_float_(&local_40);
      if (local_58 < pbVar5[local_5c]) {
        in_stack_fffffffffffffd6c = local_58;
        pbVar5 = btVector3::operator_cast_to_float_(&local_40);
        pbVar5[local_5c] = in_stack_fffffffffffffd6c;
      }
      pbVar5 = btVector3::operator_cast_to_float_(&local_40);
      if (pbVar5[local_5c] < -local_58) {
        in_stack_fffffffffffffd68 = -local_58;
        pbVar5 = btVector3::operator_cast_to_float_(&local_40);
        pbVar5[local_5c] = in_stack_fffffffffffffd68;
      }
    }
    btVector3::operator+=(&local_30->m_v,&local_40);
    bVar8 = ::operator*((btVector3 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38->m_floats);
    local_6c.m_floats._0_8_ = bVar8.m_floats._0_8_;
    local_6c.m_floats._8_8_ = bVar8.m_floats._8_8_;
    btVector3::operator+=(&local_30->m_x,&local_6c);
    local_80 = 0.0;
    local_84 = 0.0;
    local_88 = 0.0;
    btVector3::btVector3(&local_7c,&local_80,&local_84,&local_88);
    *(undefined8 *)(local_30->m_f).m_floats = local_7c.m_floats._0_8_;
    *(undefined8 *)((local_30->m_f).m_floats + 2) = local_7c.m_floats._8_8_;
  }
  updateClusters(in_stack_000003b0);
  updateBounds(in_stack_fffffffffffffdc0);
  btDbvtAabbMm::btDbvtAabbMm((btDbvtAabbMm *)in_stack_fffffffffffffd30);
  local_10 = 0;
  local_14 = btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)&in_RDI[2].m_extensionPointer);
  for (; local_10 < local_14; local_10 = local_10 + 1) {
    in_stack_ffffffffffffff50 =
         (btSoftBody *)
         btAlignedObjectArray<btSoftBody::Node>::operator[]
                   ((btAlignedObjectArray<btSoftBody::Node> *)&in_RDI[2].m_extensionPointer,local_10
                   );
    btDbvtAabbMm::FromCR
              ((btVector3 *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               (btScalar)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    in_stack_fffffffffffffd58 = (btDbvtVolume *)&in_RDI[3].m_collisionShape;
    in_stack_fffffffffffffd60 =
         *(Face **)(in_stack_ffffffffffffff50->super_btCollisionObject).
                   m_interpolationWorldTransform.m_basis.m_el[2].m_floats;
    ::operator*((btVector3 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38->m_floats);
    btDbvt::update((btDbvt *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (btDbvtNode *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                   (btVector3 *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   (btScalar)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  }
  bVar2 = btDbvt::empty((btDbvt *)&in_RDI[3].m_objectsWithoutCollisionCheck);
  if (!bVar2) {
    local_e4 = 0.0;
    while (in_stack_fffffffffffffd54 = local_e4,
          iVar3 = btAlignedObjectArray<btSoftBody::Face>::size
                            ((btAlignedObjectArray<btSoftBody::Face> *)&in_RDI[2].m_userIndex),
          (int)in_stack_fffffffffffffd54 < iVar3) {
      pFVar6 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)&in_RDI[2].m_userIndex,
                          (int)local_e4);
      operator+((btVector3 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      operator+((btVector3 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      operator/((btVector3 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      VolumeOf(in_stack_fffffffffffffd60,(btScalar)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      in_stack_fffffffffffffd40 = (btSoftBody *)&in_RDI[3].m_objectsWithoutCollisionCheck;
      in_stack_fffffffffffffd48 = pFVar6->m_leaf;
      ::operator*((btVector3 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38->m_floats);
      btDbvt::update((btDbvt *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                     (btDbvtNode *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                     (btVector3 *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     (btScalar)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      local_e4 = (btScalar)((int)local_e4 + 1);
    }
  }
  updatePose(in_stack_ffffffffffffff50);
  if ((((ulong)in_RDI[1].m_userObjectPointer & 0x100) != 0) &&
     (0.0 < in_RDI[1].m_interpolationWorldTransform.m_basis.m_el[0].m_floats[0])) {
    btMatrix3x3::btMatrix3x3
              ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               (btMatrix3x3 *)in_stack_fffffffffffffd48);
    local_188 = 0;
    iVar3 = btAlignedObjectArray<btSoftBody::Node>::size
                      ((btAlignedObjectArray<btSoftBody::Node> *)&in_RDI[2].m_extensionPointer);
    for (; local_188 < iVar3; local_188 = local_188 + 1) {
      pNVar7 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)&in_RDI[2].m_extensionPointer,
                          local_188);
      if (0.0 < pNVar7->m_im) {
        btAlignedObjectArray<btVector3>::operator[]
                  ((btAlignedObjectArray<btVector3> *)&in_RDI[1].m_userIndex,local_188);
        ::operator*((btMatrix3x3 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        operator+((btVector3 *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        bVar8 = Lerp<btVector3>((btVector3 *)in_stack_fffffffffffffd60,
                                &in_stack_fffffffffffffd58->mi,in_stack_fffffffffffffd54);
        *(long *)(pNVar7->m_x).m_floats = bVar8.m_floats._0_8_;
        *(long *)((pNVar7->m_x).m_floats + 2) = bVar8.m_floats._8_8_;
      }
    }
  }
  newsize = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  this_00 = (RContact *)(in_RDI[3].m_worldTransform.m_basis.m_el[1].m_floats + 2);
  memset(&stack0xfffffffffffffdc0,0,0x78);
  RContact::RContact(this_00);
  btAlignedObjectArray<btSoftBody::RContact>::resize
            ((btAlignedObjectArray<btSoftBody::RContact> *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),newsize,
             (RContact *)in_stack_fffffffffffffd40);
  iVar3 = (int)((ulong)(in_RDI[3].m_worldTransform.m_origin.m_floats + 2) >> 0x20);
  memset(local_280,0,0x40);
  SContact::SContact((SContact *)this_00);
  btAlignedObjectArray<btSoftBody::SContact>::resize
            ((btAlignedObjectArray<btSoftBody::SContact> *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),newsize,
             (SContact *)in_stack_fffffffffffffd40);
  btDbvt::optimizeIncremental((btDbvt *)in_stack_fffffffffffffd40,iVar3);
  btDbvt::optimizeIncremental((btDbvt *)in_stack_fffffffffffffd40,iVar3);
  btDbvt::optimizeIncremental((btDbvt *)in_stack_fffffffffffffd40,iVar3);
  return;
}

Assistant:

void			btSoftBody::predictMotion(btScalar dt)
{

	int i,ni;

	/* Update				*/ 
	if(m_bUpdateRtCst)
	{
		m_bUpdateRtCst=false;
		updateConstants();
		m_fdbvt.clear();
		if(m_cfg.collisions&fCollision::VF_SS)
		{
			initializeFaceTree();			
		}
	}

	/* Prepare				*/ 
	m_sst.sdt		=	dt*m_cfg.timescale;
	m_sst.isdt		=	1/m_sst.sdt;
	m_sst.velmrg	=	m_sst.sdt*3;
	m_sst.radmrg	=	getCollisionShape()->getMargin();
	m_sst.updmrg	=	m_sst.radmrg*(btScalar)0.25;
	/* Forces				*/ 
	addVelocity(m_worldInfo->m_gravity*m_sst.sdt);
	applyForces();
	/* Integrate			*/ 
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		n.m_q	=	n.m_x;
		btVector3 deltaV = n.m_f*n.m_im*m_sst.sdt;
		{
			btScalar maxDisplacement = m_worldInfo->m_maxDisplacement;
			btScalar clampDeltaV = maxDisplacement/m_sst.sdt;
			for (int c=0;c<3;c++)
			{
				if (deltaV[c]>clampDeltaV)
				{
					deltaV[c] = clampDeltaV;
				}
				if (deltaV[c]<-clampDeltaV)
				{
					deltaV[c]=-clampDeltaV;
				}
			}
		}
		n.m_v	+=	deltaV;
		n.m_x	+=	n.m_v*m_sst.sdt;
		n.m_f	=	btVector3(0,0,0);
	}
	/* Clusters				*/ 
	updateClusters();
	/* Bounds				*/ 
	updateBounds();	
	/* Nodes				*/ 
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	vol;
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		vol = btDbvtVolume::FromCR(n.m_x,m_sst.radmrg);
		m_ndbvt.update(	n.m_leaf,
			vol,
			n.m_v*m_sst.velmrg,
			m_sst.updmrg);
	}
	/* Faces				*/ 
	if(!m_fdbvt.empty())
	{
		for(int i=0;i<m_faces.size();++i)
		{
			Face&			f=m_faces[i];
			const btVector3	v=(	f.m_n[0]->m_v+
				f.m_n[1]->m_v+
				f.m_n[2]->m_v)/3;
			vol = VolumeOf(f,m_sst.radmrg);
			m_fdbvt.update(	f.m_leaf,
				vol,
				v*m_sst.velmrg,
				m_sst.updmrg);
		}
	}
	/* Pose					*/ 
	updatePose();
	/* Match				*/ 
	if(m_pose.m_bframe&&(m_cfg.kMT>0))
	{
		const btMatrix3x3	posetrs=m_pose.m_rot;
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			if(n.m_im>0)
			{
				const btVector3	x=posetrs*m_pose.m_pos[i]+m_pose.m_com;
				n.m_x=Lerp(n.m_x,x,m_cfg.kMT);
			}
		}
	}
	/* Clear contacts		*/ 
	m_rcontacts.resize(0);
	m_scontacts.resize(0);
	/* Optimize dbvt's		*/ 
	m_ndbvt.optimizeIncremental(1);
	m_fdbvt.optimizeIncremental(1);
	m_cdbvt.optimizeIncremental(1);
}